

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

void __thiscall
nonius::standard_reporter::print_outlier_count
          (standard_reporter *this,char *description,int count,int total)

{
  ostream *poVar1;
  int in_EDX;
  char *in_RSI;
  double in_stack_ffffffffffffff90;
  string local_38 [36];
  int local_14;
  char *local_10;
  
  if (0 < in_EDX) {
    local_14 = in_EDX;
    local_10 = in_RSI;
    poVar1 = reporter::report_stream((reporter *)0x1ed0b5);
    poVar1 = std::operator<<(poVar1,"  ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_14);
    poVar1 = std::operator<<(poVar1," (");
    nonius::detail::percentage_ratio_abi_cxx11_((double)poVar1,in_stack_ffffffffffffff90);
    poVar1 = std::operator<<(poVar1,local_38);
    poVar1 = std::operator<<(poVar1,") ");
    poVar1 = std::operator<<(poVar1,local_10);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void print_outlier_count(const char* description, int count, int total) {
            if(count > 0) report_stream() << "  " << count << " (" << detail::percentage_ratio(count, total) << ") " << description << "\n";
        }